

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O1

void av1_calculate_tile_cols
               (SequenceHeader *seq_params,int cm_mi_rows,int cm_mi_cols,CommonTileParams *tiles)

{
  long lVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  bVar3 = (byte)seq_params->mib_size_log2;
  iVar2 = 1 << (bVar3 & 0x1f);
  iVar10 = iVar2 + cm_mi_cols + -1 >> (bVar3 & 0x1f);
  iVar2 = iVar2 + cm_mi_rows + -1 >> (bVar3 & 0x1f);
  tiles->min_inner_width = -1;
  if (tiles->uniform_spacing == 0) {
    iVar11 = tiles->cols;
    iVar6 = -1;
    do {
      iVar6 = iVar6 + 1;
    } while (1 << ((byte)iVar6 & 0x1f) < iVar11);
    tiles->log2_cols = iVar6;
    if (iVar11 < 1) {
      iVar9 = 0x10000;
      iVar6 = 1;
    }
    else {
      iVar6 = 1;
      iVar9 = 0x10000;
      lVar5 = 0;
      do {
        iVar7 = tiles->col_start_sb[lVar5 + 1] - tiles->col_start_sb[lVar5];
        if (iVar6 <= iVar7) {
          iVar6 = iVar7;
        }
        if (iVar9 < iVar7) {
          iVar7 = iVar9;
        }
        lVar1 = lVar5 + 1;
        if (lVar5 < (long)iVar11 + -1) {
          iVar9 = iVar7;
        }
        lVar5 = lVar1;
      } while (iVar11 != lVar1);
    }
    bVar4 = (char)tiles->min_log2 + 1;
    if (tiles->min_log2 == 0) {
      bVar4 = 0;
    }
    iVar6 = (iVar2 * iVar10 >> (bVar4 & 0x1f)) / iVar6;
    iVar2 = 1;
    if (1 < iVar6) {
      iVar2 = iVar6;
    }
    tiles->max_height_sb = iVar2;
    if (iVar11 < 2) {
      return;
    }
    iVar9 = iVar9 << (bVar3 & 0x1f);
  }
  else {
    iVar11 = tiles->log2_cols;
    bVar3 = (byte)iVar11;
    iVar9 = iVar10 + (1 << (bVar3 & 0x1f)) + -1 >> (bVar3 & 0x1f);
    uVar8 = 0;
    if (0 < iVar10) {
      uVar8 = 0;
      iVar6 = 0;
      do {
        tiles->col_start_sb[uVar8] = iVar6;
        iVar6 = iVar6 + iVar9;
        uVar8 = uVar8 + 1;
      } while (iVar6 < iVar10);
    }
    tiles->cols = (uint)uVar8;
    tiles->col_start_sb[uVar8 & 0xffffffff] = iVar10;
    iVar11 = tiles->min_log2 - iVar11;
    iVar10 = 0;
    if (0 < iVar11) {
      iVar10 = iVar11;
    }
    tiles->min_log2_rows = iVar10;
    tiles->max_height_sb = iVar2 >> ((byte)iVar10 & 0x1f);
    iVar9 = iVar9 << ((byte)seq_params->mib_size_log2 & 0x1f);
    if (cm_mi_cols <= iVar9) {
      iVar9 = cm_mi_cols;
    }
    tiles->width = iVar9;
    if ((uint)uVar8 < 2) {
      return;
    }
  }
  tiles->min_inner_width = iVar9;
  return;
}

Assistant:

void av1_calculate_tile_cols(const SequenceHeader *const seq_params,
                             int cm_mi_rows, int cm_mi_cols,
                             CommonTileParams *const tiles) {
  int sb_cols = CEIL_POWER_OF_TWO(cm_mi_cols, seq_params->mib_size_log2);
  int sb_rows = CEIL_POWER_OF_TWO(cm_mi_rows, seq_params->mib_size_log2);
  int i;

  // This will be overridden if there is at least two columns of tiles
  // (otherwise there is no inner tile width)
  tiles->min_inner_width = -1;

  if (tiles->uniform_spacing) {
    int start_sb;
    int size_sb = CEIL_POWER_OF_TWO(sb_cols, tiles->log2_cols);
    assert(size_sb > 0);
    for (i = 0, start_sb = 0; start_sb < sb_cols; i++) {
      tiles->col_start_sb[i] = start_sb;
      start_sb += size_sb;
    }
    tiles->cols = i;
    tiles->col_start_sb[i] = sb_cols;
    tiles->min_log2_rows = AOMMAX(tiles->min_log2 - tiles->log2_cols, 0);
    tiles->max_height_sb = sb_rows >> tiles->min_log2_rows;

    tiles->width = size_sb << seq_params->mib_size_log2;
    tiles->width = AOMMIN(tiles->width, cm_mi_cols);
    if (tiles->cols > 1) {
      tiles->min_inner_width = tiles->width;
    }
  } else {
    int max_tile_area_sb = (sb_rows * sb_cols);
    int widest_tile_sb = 1;
    int narrowest_inner_tile_sb = 65536;
    tiles->log2_cols = tile_log2(1, tiles->cols);
    for (i = 0; i < tiles->cols; i++) {
      int size_sb = tiles->col_start_sb[i + 1] - tiles->col_start_sb[i];
      widest_tile_sb = AOMMAX(widest_tile_sb, size_sb);
      // ignore the rightmost tile in frame for determining the narrowest
      if (i < tiles->cols - 1)
        narrowest_inner_tile_sb = AOMMIN(narrowest_inner_tile_sb, size_sb);
    }
    if (tiles->min_log2) {
      max_tile_area_sb >>= (tiles->min_log2 + 1);
    }
    tiles->max_height_sb = AOMMAX(max_tile_area_sb / widest_tile_sb, 1);
    if (tiles->cols > 1) {
      tiles->min_inner_width = narrowest_inner_tile_sb
                               << seq_params->mib_size_log2;
    }
  }
}